

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimum.cpp
# Opt level: O3

bool __thiscall Minimum<1>::propagate(Minimum<1> *this)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  IntVar *pIVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  Clause *c;
  TrailElem local_40;
  
  pIVar9 = (this->y).var;
  lVar12 = (this->min_max).v;
  lVar5 = (long)(pIVar9->min).v;
  if (SBORROW8(lVar12,-lVar5) == lVar12 + lVar5 < 0) {
LAB_00152f5b:
    if (this->lower_change == true) {
      lVar12 = 0x7fffffffffffffff;
      iVar3 = this->sz;
      lVar5 = (long)iVar3;
      if (lVar5 < 1) {
LAB_00152fba:
        if (so.lazy == true) {
          local_40.pt = (int *)malloc(lVar5 * 4 + 0xc);
          *local_40.pt = iVar3 * 0x100 + 0x102;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_40);
          puVar14 = (uint *)local_40.pt;
          if (0 < this->sz) {
            lVar5 = 0;
            uVar11 = 1;
            do {
              plVar1 = *(long **)((long)&this->x->var + lVar5);
              uVar4 = (**(code **)(*plVar1 + 0x60))(plVar1,-lVar12);
              if (*puVar14 >> 8 <= uVar11) goto LAB_0015318f;
              ((int *)puVar14)[uVar11 + 1] = uVar4;
              lVar5 = lVar5 + 0x10;
              bVar7 = (long)uVar11 < (long)this->sz;
              uVar11 = uVar11 + 1;
            } while (bVar7);
          }
        }
        else {
          puVar14 = (uint *)0x0;
        }
        pIVar9 = (this->y).var;
        iVar3 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xf])
                          (pIVar9,-lVar12,puVar14,1);
        if ((char)iVar3 == '\0') goto LAB_0015317c;
        iVar10 = (((this->y).var)->max).v;
      }
      else {
        lVar8 = 0;
        lVar6 = lVar12;
        do {
          lVar13 = (long)*(int *)(*(long *)((long)&this->x->var + lVar8) + 0x10);
          lVar12 = -lVar13;
          if (SBORROW8(lVar6,lVar12) != lVar6 + lVar13 < 0) {
            lVar12 = lVar6;
          }
          lVar8 = lVar8 + 0x10;
          lVar6 = lVar12;
        } while (lVar5 << 4 != lVar8);
        iVar10 = (((this->y).var)->max).v;
        lVar6 = -(long)iVar10;
        if (lVar12 != lVar6 && SBORROW8(lVar12,lVar6) == lVar12 + iVar10 < 0) goto LAB_00152fba;
      }
      if (so.lazy == true) {
        local_40.pt = (int *)malloc(0x10);
        *local_40.pt = 0x202;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_40);
        puVar14 = (uint *)local_40.pt;
        uVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
        if (*puVar14 < 0x200) {
LAB_0015318f:
          abort();
        }
        ((int *)puVar14)[2] = uVar4;
      }
      else {
        puVar14 = (uint *)0x0;
      }
      iVar3 = this->sz;
      if (0 < iVar3) {
        lVar5 = 0;
        lVar12 = 0;
        do {
          plVar1 = *(long **)((long)&this->x->var + lVar5);
          if (iVar10 < (int)plVar1[2]) {
            cVar2 = (**(code **)(*plVar1 + 0x78))(plVar1,(long)iVar10,puVar14,1);
            if (cVar2 == '\0') goto LAB_0015317c;
            iVar3 = this->sz;
          }
          lVar12 = lVar12 + 1;
          lVar5 = lVar5 + 0x10;
        } while (lVar12 < iVar3);
      }
    }
    bVar7 = true;
    if ((long)(((this->y).var)->max).v + (this->min_max).v == 0) {
      local_40.pt = (int *)&(this->super_Propagator).satisfied;
      local_40.x = (int)(this->super_Propagator).satisfied.v;
      local_40.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_40);
      (this->super_Propagator).satisfied.v = '\x01';
    }
  }
  else {
    if (so.lazy) {
      iVar3 = (*((this->x[(this->min_max_var).v].var)->super_Var).super_Branching._vptr_Branching[8]
              )();
      lVar5 = (long)iVar3 * 4 + 2;
      pIVar9 = (this->y).var;
    }
    else {
      lVar5 = 0;
    }
    iVar3 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xe])(pIVar9,-lVar12,lVar5,1);
    if ((char)iVar3 != '\0') goto LAB_00152f5b;
LAB_0015317c:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool propagate() override {
		// make a less than or equal to min(max(x_i))
		setDom(y, setMax, min_max, x[min_max_var].getMaxLit());

		if (lower_change) {
			// make a greater than or equal to min(min(b_i))
			int64_t m = INT64_MAX;
			for (int i = 0; i < sz; i++) {
				const int64_t t = x[i].getMin();
				if (t < m) {
					m = t;
				}
			}
			if (y.setMinNotR(m)) {
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(sz + 1);
					// Finesse lower bounds
					// Add reason ![y <= m-1] \/ [x_1 <= m-1] \/ ... \/ [x_n <= m-1]
					for (int i = 0; i < sz; i++) {
						(*r)[i + 1] = x[i].getFMinLit(m);
					}
					//					for (int i = 0; i < sz; i++) (*r)[i+1] = x[i].getLit(m-1, LR_LE);
				}
				if (!y.setMin(m, r)) {
					return false;
				}
			}

			// make b_i greater than or equal to min(a)
			m = y.getMin();
			Clause* r = nullptr;
			if (so.lazy) {
				r = Reason_new(2);
				(*r)[1] = y.getMinLit();
			}
			for (int i = 0; i < sz; i++) {
				if (x[i].setMinNotR(m)) {
					if (!x[i].setMin(m, r)) {
						return false;
					}
				}
			}
		}

		// Necessary and sufficient conditions for redundancy

		if (y.getMin() == min_max) {
			satisfied = true;
		}

		return true;
	}